

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O0

int quote_fname_ufs(char *file)

{
  char cVar1;
  char local_128 [8];
  char fbuf [256];
  char *pcStack_20;
  int extensionp;
  char *dp;
  char *cp;
  char *file_local;
  
  pcStack_20 = local_128;
  for (dp = file; *dp != '\0'; dp = dp + 1) {
    cVar1 = *dp;
    if (((cVar1 == '\'') || (cVar1 == ';')) || (cVar1 == '>')) {
      *pcStack_20 = '\'';
      pcStack_20[1] = *dp;
      pcStack_20 = pcStack_20 + 2;
    }
    else {
      *pcStack_20 = *dp;
      pcStack_20 = pcStack_20 + 1;
    }
  }
  *pcStack_20 = '\0';
  dp = local_128;
  fbuf[0xfc] = '\0';
  fbuf[0xfd] = '\0';
  fbuf[0xfe] = '\0';
  fbuf[0xff] = '\0';
  while (*dp != '\0' && fbuf._252_4_ == 0) {
    if (*dp == '\'') {
      if (dp[1] == '\0') {
        dp = dp + 1;
      }
      else {
        dp = dp + 2;
      }
    }
    else if (*dp == '.') {
      if (dp[1] != '\0') {
        fbuf[0xfc] = '\x01';
        fbuf[0xfd] = '\0';
        fbuf[0xfe] = '\0';
        fbuf[0xff] = '\0';
      }
      dp = dp + 1;
    }
    else {
      dp = dp + 1;
    }
  }
  if (fbuf._252_4_ == 0) {
    if (dp[-1] == '.') {
      dp[-1] = '\'';
      *dp = '.';
      dp = dp + 1;
    }
    *dp = '.';
    dp[1] = '\0';
  }
  strcpy(file,local_128);
  return 1;
}

Assistant:

int quote_fname_ufs(char *file)
{
  char *cp, *dp;
  int extensionp;
  char fbuf[MAXNAMLEN + 1];

  cp = file;
  dp = fbuf;

  while (*cp) {
    switch (*cp) {
      case '>':
      case ';':
      case '\'':
        *dp++ = '\'';
        *dp++ = *cp++;
        break;

      default: *dp++ = *cp++; break;
    }
  }
  *dp = '\0';

  /*
   * extensionp indicates whether extension field is included in a file
   * name or not.  If extension field is not included, we have to add a
   * period to specify empty extension field.
   */
  cp = fbuf;
  extensionp = 0;
  while (*cp && !extensionp) {
    switch (*cp) {
      case '.':
        if (*(cp + 1)) extensionp = 1;
        cp++;
        break;

      case '\'':
        if (*(cp + 1) != '\0')
          cp += 2;
        else
          cp++;
        break;

      default: cp++; break;
    }
  }
  if (!extensionp) {
    if (*(cp - 1) == '.') {
      *(cp - 1) = '\'';
      *cp++ = '.';
    }
    *cp++ = '.';
    *cp = '\0';
  }
  strcpy(file, fbuf);
  return (1);
}